

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_zTXt(png_structrp png_ptr,png_const_charp key,png_const_charp text,int compression)

{
  png_uint_32 pVar1;
  uint prefix_len;
  int iVar2;
  png_alloc_size_t local_4b0;
  undefined1 local_4a0 [8];
  compression_state comp;
  png_byte new_key [81];
  png_uint_32 key_len;
  int compression_local;
  png_const_charp text_local;
  png_const_charp key_local;
  png_structrp png_ptr_local;
  
  if (compression == -1) {
    png_write_tEXt(png_ptr,key,text,0);
  }
  else {
    if (compression != 0) {
      png_error(png_ptr,"zTXt: invalid compression type");
    }
    pVar1 = png_check_keyword(png_ptr,key,comp.output + 0x3fc);
    if (pVar1 == 0) {
      png_error(png_ptr,"zTXt: invalid keyword");
    }
    new_key[(ulong)(pVar1 + 1) - 8] = '\0';
    prefix_len = pVar1 + 2;
    if (text == (png_const_charp)0x0) {
      local_4b0 = 0;
    }
    else {
      local_4b0 = strlen(text);
    }
    png_text_compress_init((compression_state *)local_4a0,(png_const_bytep)text,local_4b0);
    iVar2 = png_text_compress(png_ptr,0x7a545874,(compression_state *)local_4a0,prefix_len);
    if (iVar2 != 0) {
      png_error(png_ptr,(png_ptr->zstream).msg);
    }
    png_write_chunk_header(png_ptr,0x7a545874,prefix_len + (int)comp.input_len);
    png_write_chunk_data(png_ptr,comp.output + 0x3fc,(ulong)prefix_len);
    png_write_compressed_data_out(png_ptr,(compression_state *)local_4a0);
    png_write_chunk_end(png_ptr);
  }
  return;
}

Assistant:

void /* PRIVATE */
png_write_zTXt(png_structrp png_ptr, png_const_charp key, png_const_charp text,
    int compression)
{
   png_uint_32 key_len;
   png_byte new_key[81];
   compression_state comp;

   png_debug(1, "in png_write_zTXt");

   if (compression == PNG_TEXT_COMPRESSION_NONE)
   {
      png_write_tEXt(png_ptr, key, text, 0);
      return;
   }

   if (compression != PNG_TEXT_COMPRESSION_zTXt)
      png_error(png_ptr, "zTXt: invalid compression type");

   key_len = png_check_keyword(png_ptr, key, new_key);

   if (key_len == 0)
      png_error(png_ptr, "zTXt: invalid keyword");

   /* Add the compression method and 1 for the keyword separator. */
   new_key[++key_len] = PNG_COMPRESSION_TYPE_BASE;
   ++key_len;

   /* Compute the compressed data; do it now for the length */
   png_text_compress_init(&comp, (png_const_bytep)text,
       text == NULL ? 0 : strlen(text));

   if (png_text_compress(png_ptr, png_zTXt, &comp, key_len) != Z_OK)
      png_error(png_ptr, png_ptr->zstream.msg);

   /* Write start of chunk */
   png_write_chunk_header(png_ptr, png_zTXt, key_len + comp.output_len);

   /* Write key */
   png_write_chunk_data(png_ptr, new_key, key_len);

   /* Write the compressed data */
   png_write_compressed_data_out(png_ptr, &comp);

   /* Close the chunk */
   png_write_chunk_end(png_ptr);
}